

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpOperations.cpp
# Opt level: O0

pointer gmlc::networking::establishConnection
                  (SocketFactory *sf,io_context *io_context,string *address,milliseconds timeOut)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  pointer pVar1;
  string *in_stack_00000088;
  string *in_stack_00000090;
  io_context *in_stack_00000098;
  string port;
  string interface;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *this_00;
  undefined8 in_stack_ffffffffffffff68;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_48 [4];
  
  std::__cxx11::string::string(in_stack_ffffffffffffff10);
  std::__cxx11::string::string(in_stack_ffffffffffffff10);
  extractInterfaceAndPortString((string *)in_stack_ffffffffffffff68);
  this = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&stack0xffffffffffffff38;
  this_00 = local_48;
  std::tie<std::__cxx11::string,std::__cxx11::string>
            (in_stack_ffffffffffffff08,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
            (this_00,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&stack0xffffffffffffff58);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(this);
  establishConnection((SocketFactory *)port._M_dataplus._M_p,in_stack_00000098,in_stack_00000090,
                      in_stack_00000088,(milliseconds)port._M_string_length);
  std::__cxx11::string::~string(&this->first);
  std::__cxx11::string::~string(&this->first);
  pVar1.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  pVar1.super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (pointer)pVar1.
                  super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TcpConnection::pointer establishConnection(
    const SocketFactory& sf,
    asio::io_context& io_context,
    const std::string& address,
    std::chrono::milliseconds timeOut)
{
    std::string interface;
    std::string port;
    std::tie(interface, port) = extractInterfaceAndPortString(address);
    return establishConnection(sf, io_context, interface, port, timeOut);
}